

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

char __thiscall RandomBotStrategy::yesOrNo(RandomBotStrategy *this,StrategyContext context)

{
  char cVar1;
  initializer_list<char> __l;
  result_type_conflict1 rVar2;
  ostream *poVar3;
  reference pvVar4;
  char *pcVar5;
  random_device local_2778;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13f0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_68;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  allocator_type local_43;
  char local_42 [2];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> optionVector;
  StrategyContext context_local;
  RandomBotStrategy *this_local;
  
  local_42[0] = 'y';
  local_42[1] = 0x6e;
  local_40 = local_42;
  local_38 = 2;
  optionVector.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = context;
  std::allocator<char>::allocator();
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_30,__l,&local_43);
  std::allocator<char>::~allocator(&local_43);
  local_60._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin
                         ((vector<char,_std::allocator<char>_> *)local_30);
  local_68._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)local_30);
  std::random_device::random_device(&local_2778);
  rVar2 = std::random_device::operator()(&local_2778);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_13f0,(ulong)rVar2);
  std::
  shuffle<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (local_60,local_68,&local_13f0);
  std::random_device::~random_device(&local_2778);
  if (optionVector.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0) {
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_30,0);
    pcVar5 = " no, master";
    if (*pvVar4 == 'y') {
      pcVar5 = " yes, master";
    }
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else if (optionVector.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 6) {
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_30,0);
    pcVar5 = " no, master";
    if (*pvVar4 == 'y') {
      pcVar5 = " yes, master";
    }
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else if (optionVector.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 10) {
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_30,0);
    pcVar5 = " no, master";
    if (*pvVar4 == 'y') {
      pcVar5 = " yes, master";
    }
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_30,0);
  cVar1 = *pvVar4;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_30)
  ;
  return cVar1;
}

Assistant:

signed char RandomBotStrategy::yesOrNo(StrategyContext context) {
    std::vector<char> optionVector = {'y', 'n'};
    std::shuffle(optionVector.begin(), optionVector.end(), std::mt19937(std::random_device()())); // randomize the option vector
    switch((int) context) {
        case StrategyContext::ATTACK:
            std::cout << ((optionVector[0] == 'y') ? " yes, master" : " no, master") << std::endl;
            break;
        case StrategyContext::FORTIFY:
            std::cout << ((optionVector[0] == 'y') ? " yes, master" : " no, master") << std::endl;
            break;
        case StrategyContext::REINFORCE:
            std::cout << ((optionVector[0] == 'y') ? " yes, master" : " no, master") << std::endl;
            break;
    }
    return optionVector[0];
}